

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

curltime get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  timediff_t tVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  curltime cVar8;
  curltime newer;
  curltime older;
  curltime t;
  time_t local_50;
  long local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  
  local_50 = 0;
  lVar5 = 0;
  uVar6 = 0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    if ((((*(long *)(&cf->sockindex + lVar5 * 2) != 0) &&
         (plVar1 = *(long **)(*(long *)(&cf->sockindex + lVar5 * 2) + 0x28), plVar1 != (long *)0x0))
        && (iVar3 = (**(code **)(*plVar1 + 0x70))(plVar1,data,query,0,&local_48), iVar3 == 0)) &&
       ((newer.tv_usec = uStack_40, newer.tv_sec = local_48, uStack_40 != 0 || local_48 != 0 &&
        (newer._12_4_ = 0, older._8_8_ = uVar6, older.tv_sec = local_50,
        tVar4 = Curl_timediff_us(newer,older), 0 < tVar4)))) {
      local_50 = local_48;
      uVar6 = (ulong)uStack_40;
    }
    lVar5 = 1;
    bVar2 = false;
  } while (bVar7);
  cVar8._8_8_ = uVar6;
  cVar8.tv_sec = local_50;
  return cVar8;
}

Assistant:

static struct curltime get_max_baller_time(struct Curl_cfilter *cf,
                                          struct Curl_easy *data,
                                          int query)
{
  struct cf_he_ctx *ctx = cf->ctx;
  struct curltime t, tmax;
  size_t i;

  memset(&tmax, 0, sizeof(tmax));
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    struct eyeballer *baller = ctx->baller[i];

    memset(&t, 0, sizeof(t));
    if(baller && baller->cf &&
       !baller->cf->cft->query(baller->cf, data, query, NULL, &t)) {
      if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
        tmax = t;
    }
  }
  return tmax;
}